

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canal.cc
# Opt level: O1

void search<OffsetBoundSymbolMatcher,unsigned_int>
               (csptr *view,OffsetBoundSymbolMatcher *m,Addr loc,AddressRanges *searchaddrs,
               SymbolStore *store,bool showaddrs)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer ppVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  uint *puVar6;
  ostream *poVar7;
  pair<unsigned_long,_unsigned_long> *range;
  pointer ppVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  _Base_ptr *pp_Var11;
  ulong uVar12;
  undefined1 auStack_80190 [8];
  ReaderArray<unsigned_int,_131072UL> r;
  IOFlagSave _;
  
  pstack::IOFlagSave::IOFlagSave
            ((IOFlagSave *)(r.cache._M_elems + 0x1fffe),
             (ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  pstack::ReaderArray<unsigned_int,_131072UL>::ReaderArray
            ((ReaderArray<unsigned_int,_131072UL> *)auStack_80190,
             (view->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
  if ((searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    if (r.cacheEnd != 0) {
      p_Var1 = &(store->store_)._M_t._M_impl.super__Rb_tree_header;
      sVar9 = 0;
      do {
        puVar6 = pstack::ReaderArray<unsigned_int,_131072UL>::getitem
                           ((ReaderArray<unsigned_int,_131072UL> *)auStack_80190,sVar9);
        uVar12 = (ulong)*puVar6;
        p_Var4 = (store->store_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar12]) {
          if (*(ulong *)(p_Var4 + 1) >= uVar12) {
            p_Var10 = p_Var4;
          }
        }
        if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
           ((long)&(p_Var10[1]._M_left)->_M_color + *(long *)(p_Var10 + 2) + m->offset_ != uVar12))
        {
          bVar5 = false;
          pp_Var11 = (_Base_ptr *)0x0;
        }
        else {
          pp_Var11 = &p_Var10[1]._M_parent;
          bVar5 = true;
        }
        if (bVar5) {
          if (showaddrs) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)pp_Var11[4],(long)pp_Var11[5]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," 0x",3);
            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ... size=",10);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", diff=",7);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          pp_Var11[8] = (_Base_ptr)((long)pp_Var11[8] + 1);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != r.cacheEnd);
    }
  }
  else if (r.cacheEnd != 0) {
    sVar9 = 0;
    do {
      puVar6 = pstack::ReaderArray<unsigned_int,_131072UL>::getitem
                         ((ReaderArray<unsigned_int,_131072UL> *)auStack_80190,sVar9);
      ppVar8 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar3) {
        uVar2 = *puVar6;
        do {
          if ((ppVar8->first <= (ulong)uVar2) && ((ulong)uVar2 < ppVar8->second)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
            *(uint *)(pstack::Flags::add + *(long *)(std::cout + -0x18)) =
                 *(uint *)(pstack::Flags::add + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
          ppVar8 = ppVar8 + 1;
        } while (ppVar8 != ppVar3);
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != r.cacheEnd);
  }
  pstack::IOFlagSave::~IOFlagSave((IOFlagSave *)(r.cache._M_elems + 0x1fffe));
  return;
}

Assistant:

inline void search(
        const Reader::csptr &view,
        const Matcher & m,
        Elf::Addr loc,
        const AddressRanges &searchaddrs,
        SymbolStore &store,
        bool showaddrs) {
    try {
        IOFlagSave _(cout);
        ReaderArray<Word, 131072> r(*view, 0);
        auto start = r.begin();
        if (searchaddrs.size()) {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                for (const auto &range : searchaddrs )
                    if (p >= range.first && p < range.second)
                        cout << "0x" << hex << loc + (cur - start) * sizeof( Word) << dec << "\n";
            }
        } else {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                if ( auto [ found, sym ] = store.find(p, m); found) {
                    if (showaddrs)
                        cout
                            << sym->name << " 0x" << std::hex << loc + (cur - start) * sizeof(Word)
                            << std::dec <<  " ... size=" << sym->sym.st_size
                            << ", diff=" << p - sym->memaddr() << endl;
#ifdef WITH_PYTHON
                    if (py) {
                        std::cout << "pyo " << Elf::Addr(loc) << " ";
                        py->print(Elf::Addr(loc) - sizeof (PyObject) +
                                sizeof (struct _typeobject *));
                        std::cout << "\n";
                    }
#endif
                    sym->count++;
                }
            }
        }
    } catch (const std::exception &ex) {
        std::clog << "warning: error reading data at " << std::hex << loc << std::dec << ": " << ex.what() << "\n";
    }
}